

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall apngasm::APNGAsm::~APNGAsm(APNGAsm *this)

{
  APNGAsm *this_local;
  
  reset(this);
  std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::~vector(&this->_info_chunks);
  std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::~vector(&this->_frames);
  return;
}

Assistant:

APNGAsm::~APNGAsm()
  {
    reset();
  }